

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v9::detail::format_decimal<char,unsigned__int128>(char *out,unsigned___int128 value,int size)

{
  undefined1 n [16];
  format_decimal_result<char_*> fVar1;
  int iVar2;
  size_t value_00;
  char *pcVar3;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  char *end;
  undefined8 in_stack_ffffffffffffff48;
  int line;
  char *pcVar5;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 uVar6;
  ulong local_68;
  ulong local_60;
  char *local_50;
  char *local_30;
  
  auVar4._8_8_ = in_RDX;
  auVar4._0_8_ = in_RSI;
  line = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  n._8_8_ = in_stack_ffffffffffffff58;
  n._0_8_ = in_stack_ffffffffffffff50;
  iVar2 = count_digits((uint128_opt)n);
  if (iVar2 <= in_ECX) {
    local_50 = (char *)(in_RDI + in_ECX);
    while (local_60 = auVar4._8_8_, local_68 = auVar4._0_8_, (local_68 < 100) <= local_60) {
      local_50 = local_50 + -2;
      uVar6 = 100;
      pcVar5 = local_50;
      value_00 = __umodti3(local_68,local_60);
      pcVar3 = digits2(value_00);
      *(undefined2 *)pcVar5 = *(undefined2 *)pcVar3;
      auVar4 = __udivti3(local_68,local_60,uVar6,0);
    }
    if (local_60 == 0 && (ulong)(9 < local_68) <= -local_60) {
      local_68._0_1_ = auVar4[0];
      local_30 = local_50 + -1;
      local_50[-1] = (char)local_68 + '0';
    }
    else {
      local_30 = local_50 + -2;
      pcVar5 = local_30;
      pcVar3 = digits2(local_68);
      *(undefined2 *)pcVar5 = *(undefined2 *)pcVar3;
    }
    fVar1.end = (char *)(in_RDI + in_ECX);
    fVar1.begin = local_30;
    return fVar1;
  }
  assert_fail(in_stack_ffffffffffffff50,line,(char *)0x1beaed);
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}